

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_freeAttributes__sdev
          (ColladaParserAutoGen15Private *this,void *attributeData)

{
  StackMemoryManager *in_RSI;
  sdev__AttributeData *in_RDI;
  sdev__AttributeData *typedAttributeData;
  StackMemoryManager *this_00;
  
  this_00 = in_RSI;
  if (in_RSI[0xf].mFrames != (StackFrame *)0x0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject(in_RSI);
  }
  if (in_RSI[0x20].mFrames != (StackFrame *)0x0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject(this_00);
  }
  sdev__AttributeData::~sdev__AttributeData(in_RDI);
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_freeAttributes__sdev( void* attributeData )
{
    sdev__AttributeData* typedAttributeData = static_cast<sdev__AttributeData*>(attributeData);
    if (typedAttributeData->_class.data)
    {
        mStackMemoryManager.deleteObject();
    }

    if (typedAttributeData->unknownAttributes.data)
    {
        mStackMemoryManager.deleteObject();
    }


    typedAttributeData->~sdev__AttributeData();

    return true;
}